

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter.c
# Opt level: O0

void cdash_show_fail(TestReporter *reporter,char *file,int line,char *message,
                    __va_list_tag *arguments)

{
  time_t tVar1;
  char *name_00;
  CDashMemo *in_RCX;
  long in_RDI;
  char *in_R8;
  float fVar2;
  double dVar3;
  CDashMemo *memo;
  float exectime;
  char *name;
  CgreenBreadcrumb *in_stack_ffffffffffffffb8;
  CDashMemo *memo_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  time_t in_stack_ffffffffffffffd0;
  
  memo_00 = *(CDashMemo **)(in_RDI + 0x88);
  tVar1 = cdash_current_time(name);
  memo_00->testfinished = tVar1;
  dVar3 = cdash_elapsed_time(in_stack_ffffffffffffffd0,
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  fVar2 = (float)dVar3;
  name_00 = get_current_from_breadcrumb(in_stack_ffffffffffffffb8);
  print_test_header(in_RCX,in_R8,name_00,(char *)CONCAT44(fVar2,in_stack_ffffffffffffffc8),
                    (int)((ulong)memo_00 >> 0x20));
  print_results_header(memo_00,(char *)in_stack_ffffffffffffffb8,0.0);
  print_measurement(memo_00,(char *)in_stack_ffffffffffffffb8,(__va_list_tag *)0x10aebf);
  print_tail((CDashMemo *)0x10aec9);
  return;
}

Assistant:

static void cdash_show_fail(TestReporter *reporter, const char *file, int line, const char *message, va_list arguments) {
    const char *name;
    float exectime;
    CDashMemo *memo;

    memo = (CDashMemo *)reporter->memo;

    memo->testfinished = cdash_current_time(NULL);

    exectime = (float)cdash_elapsed_time(memo->teststarted, memo->testfinished);

    name = get_current_from_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);

    print_test_header(memo, "failed", name, file, line);
    print_results_header(memo, name, exectime);
    print_measurement(memo, message, arguments);
    print_tail(memo);
}